

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

void __thiscall CVmObjVector::mark_refs(CVmObjVector *this,uint state)

{
  ushort uVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar1 = *(ushort *)(pcVar2 + 2);
  for (lVar3 = 0; (ulong)uVar1 * 5 != lVar3; lVar3 = lVar3 + 5) {
    if (pcVar2[lVar3 + 4] == '\x05') {
      CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar2 + lVar3 + 5),state);
    }
  }
  return;
}

Assistant:

void CVmObjVector::mark_refs(VMG_ uint state)
{
    /* get my element count */
    size_t cnt = get_element_count();

    /* mark as referenced each object in the vector */
    for (char *p = get_element_ptr(0) ; cnt != 0 ;
         --cnt, inc_element_ptr(&p))
    {
        /* 
         *   if this is an object, mark it as referenced, and mark its
         *   references as referenced 
         */
        if (vmb_get_dh_type(p) == VM_OBJ)
            G_obj_table->mark_all_refs(vmb_get_dh_obj(p), state);
    }
}